

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double **ppdVar8;
  bool bVar9;
  uint uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int k;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  double dVar19;
  int iVar20;
  BeagleCPUImpl<double,_1,_0> *pBVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b9;
  BeagleCPUImpl<double,_1,_0> *local_b8;
  ulong local_b0;
  int *local_a8;
  double local_a0;
  ulong local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  long local_70;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar17 = (ulong)(uint)count;
  local_a8 = scaleBufferIndices;
  local_90 = bufferIndices;
  local_80 = categoryWeightsIndices;
  local_78 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  local_b8 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)this->kPatternCount,&local_b9);
  pBVar21 = local_b8;
  local_98 = uVar17;
  if (0 < count) {
    uVar16 = 0;
    local_68 = (ulong)(count - 1);
    uVar12 = (ulong)(uint)local_b8->kPatternCount;
    local_88 = uVar17;
    do {
      local_70 = (long)local_90[uVar16];
      pdVar5 = pBVar21->gStateFrequencies[local_78[uVar16]];
      pdVar11 = pBVar21->gPartials[local_70];
      pdVar6 = pBVar21->gCategoryWeights[local_80[uVar16]];
      iVar15 = 0;
      iVar23 = (int)uVar12;
      if (0 < iVar23) {
        iVar18 = 0;
        iVar20 = 0;
        iVar4 = local_b8->kStateCount;
        pdVar7 = local_b8->integrationTmp;
        iVar15 = 0;
        do {
          if (0 < iVar4) {
            iVar22 = 0;
            lVar14 = 0;
            do {
              iVar22 = iVar22 + -1;
              *(double *)((long)pdVar7 + lVar14 + (long)iVar20 * 8) =
                   *(double *)((long)pdVar11 + lVar14 + (long)iVar15 * 8) * *pdVar6;
              lVar14 = lVar14 + 8;
            } while (-iVar4 != iVar22);
            iVar20 = iVar20 - iVar22;
            iVar15 = iVar15 - iVar22;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar23);
      }
      local_a0 = (double)(long)local_b8->kCategoryCount;
      if (1 < (long)local_a0) {
        iVar4 = local_b8->kStateCount;
        dVar19 = 4.94065645841247e-324;
        do {
          if (0 < iVar23) {
            pdVar7 = local_b8->integrationTmp;
            iVar18 = 0;
            iVar20 = 0;
            do {
              if (0 < iVar4) {
                iVar22 = 0;
                lVar14 = 0;
                do {
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *(ulong *)((long)pdVar11 + lVar14 + (long)iVar15 * 8);
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = pdVar6[(long)dVar19];
                  iVar22 = iVar22 + -1;
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = *(ulong *)((long)pdVar7 + lVar14 + (long)iVar20 * 8);
                  auVar26 = vfmadd213sd_fma(auVar28,auVar24,auVar26);
                  *(long *)((long)pdVar7 + lVar14 + (long)iVar20 * 8) = auVar26._0_8_;
                  lVar14 = lVar14 + 8;
                } while (-iVar4 != iVar22);
                iVar20 = iVar20 - iVar22;
                iVar15 = iVar15 - iVar22;
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar23);
          }
          dVar19 = (double)((long)dVar19 + 1);
        } while (dVar19 != local_a0);
      }
      pBVar21 = local_b8;
      local_b0 = uVar16;
      if (0 < iVar23) {
        lVar14 = 0;
        iVar23 = 0;
        do {
          iVar15 = pBVar21->kStateCount;
          if ((long)iVar15 < 1) {
            dVar19 = 0.0;
          }
          else {
            auVar26 = ZEXT816(0);
            lVar13 = 0;
            do {
              auVar25._8_8_ = 0;
              auVar25._0_8_ = pdVar5[lVar13];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = pBVar21->integrationTmp[iVar23 + lVar13];
              auVar26 = vfmadd231sd_fma(auVar26,auVar25,auVar2);
              dVar19 = auVar26._0_8_;
              lVar13 = lVar13 + 1;
            } while (iVar15 != lVar13);
            iVar23 = iVar23 + iVar15;
          }
          uVar10 = (uint)pBVar21->kFlags;
          if (*local_a8 == -1) {
            if ((uVar10 >> 8 & 1) != 0) goto LAB_0012aedf;
          }
          else {
            if ((uVar10 >> 8 & 1) == 0) {
              iVar15 = local_a8[uVar16];
              bVar9 = true;
            }
            else {
LAB_0012aedf:
              iVar15 = (int)local_70 - pBVar21->kTipCount;
              bVar9 = false;
            }
            ppdVar8 = pBVar21->gScaleBuffers;
            pdVar11 = ppdVar8[iVar15];
            if (uVar16 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar14] = 0;
              uVar17 = 0;
              dVar1 = pdVar11[lVar14];
              auVar27 = ZEXT864((ulong)dVar1);
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] = dVar1;
              if ((int)local_98 != 1) {
                uVar16 = 1;
                uVar17 = 0;
                do {
                  if (bVar9) {
                    iVar15 = local_a8[uVar16];
                  }
                  else {
                    iVar15 = local_90[uVar16] - pBVar21->kTipCount;
                  }
                  dVar1 = ppdVar8[iVar15][lVar14];
                  if (auVar27._0_8_ < dVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = (int)uVar16;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = dVar1;
                    uVar17 = uVar16 & 0xffffffff;
                    auVar27 = ZEXT864((ulong)dVar1);
                  }
                  uVar16 = uVar16 + 1;
                } while (local_88 != uVar16);
              }
            }
            else {
              uVar17 = (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar14];
            }
            uVar16 = local_b0;
            if (local_b0 != uVar17) {
              local_a0 = dVar19;
              dVar19 = exp(pdVar11[lVar14] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14]);
              dVar19 = local_a0 * dVar19;
              uVar16 = local_b0;
              pBVar21 = local_b8;
            }
          }
          pdVar11 = pBVar21->outLogLikelihoodsTmp;
          if (uVar16 == 0) {
            pdVar11[lVar14] = dVar19;
          }
          else {
            dVar19 = dVar19 + pdVar11[lVar14];
            if (uVar16 == local_68) {
              dVar19 = log(dVar19);
              pdVar11 = local_b8->outLogLikelihoodsTmp;
              uVar16 = local_b0;
              pBVar21 = local_b8;
            }
            pdVar11[lVar14] = dVar19;
          }
          uVar12 = (ulong)pBVar21->kPatternCount;
          lVar14 = lVar14 + 1;
        } while (lVar14 < (long)uVar12);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != local_88);
  }
  if (*local_a8 == -1) {
    uVar10 = pBVar21->kPatternCount;
    if ((pBVar21->kFlags & 0x100) != 0) goto LAB_0012b033;
LAB_0012b062:
    *outSumLogLikelihood = 0.0;
    if (0 < (int)uVar10) {
      pdVar5 = pBVar21->gPatternWeights;
      pdVar11 = pBVar21->outLogLikelihoodsTmp;
      auVar26 = ZEXT816(0) << 0x40;
      uVar17 = 0;
      do {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = pdVar11[uVar17];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar5[uVar17];
        auVar26 = vfmadd231sd_fma(auVar26,auVar29,auVar3);
        uVar17 = uVar17 + 1;
        dVar19 = auVar26._0_8_;
        *outSumLogLikelihood = dVar19;
      } while (uVar10 != uVar17);
      iVar23 = (uint)(!NAN(dVar19) && !NAN(dVar19)) * 8 + -8;
      goto LAB_0012b0b5;
    }
  }
  else {
    uVar10 = pBVar21->kPatternCount;
LAB_0012b033:
    if (0 < (int)uVar10) {
      pdVar5 = pBVar21->outLogLikelihoodsTmp;
      uVar17 = 0;
      do {
        pdVar5[uVar17] =
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17] + pdVar5[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      goto LAB_0012b062;
    }
    *outSumLogLikelihood = 0.0;
  }
  iVar23 = 0;
LAB_0012b0b5:
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar23;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}